

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common.h
# Opt level: O2

void check_vectors<char>(vector<char,_std::allocator<char>_> *lhs,
                        vector<char,_std::allocator<char>_> *rhs)

{
  equal_coll_impl local_91;
  assertion_result local_90;
  char *local_78;
  char *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  char *local_58;
  char *local_50;
  undefined **local_48;
  undefined1 local_40;
  undefined8 *local_38;
  char *local_30;
  
  local_58 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/test/unit_test/test_common.h"
  ;
  local_50 = "";
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  local_60 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_58,0x11);
  boost::test_tools::tt_detail::equal_coll_impl::operator()
            (&local_90,&local_91,
             (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
             (lhs->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
                      (lhs->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                      super__Vector_impl_data._M_finish,
             (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
             (rhs->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
                      (rhs->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                      super__Vector_impl_data._M_finish);
  local_40 = 0;
  local_48 = &PTR__lazy_ostream_002be780;
  local_38 = &boost::unit_test::lazy_ostream::inst;
  local_30 = "";
  local_78 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/test/unit_test/test_common.h"
  ;
  local_70 = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_90,&local_48,&local_78,0x11,1,0xd,4,"lhs.begin()","lhs.end()","rhs.begin()",
             "rhs.end()");
  boost::detail::shared_count::~shared_count(&local_90.m_message.pn);
  return;
}

Assistant:

void check_vectors(const std::vector<T>& lhs, const std::vector<T>& rhs) {
  BOOST_CHECK_EQUAL_COLLECTIONS(lhs.begin(), lhs.end(), rhs.begin(), rhs.end());
}